

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

void __thiscall DReachabilityPropagator::wakeup(DReachabilityPropagator *this,int i,int param_2)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  uint local_2c;
  
  local_2c = i;
  update_innodes(this);
  bVar2 = true;
  if ((-1 < i) && (i < (int)(this->super_GraphPropagator).vs.sz)) {
    bVar3 = BoolView::isTrue((this->super_GraphPropagator).vs.data + (uint)i);
    if ((bVar3) && (this->last_state_n[(uint)i].v != 0)) {
      add_innode(this,i);
      lVar5 = 0xd8;
    }
    else {
      bVar3 = BoolView::isFalse((this->super_GraphPropagator).vs.data + (uint)i);
      if ((!bVar3) || (lVar5 = 0x108, this->last_state_n[(uint)i].v == 1)) goto LAB_001a5eee;
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar5),
               (int *)&local_2c);
    bVar2 = false;
  }
LAB_001a5eee:
  uVar1 = (this->super_GraphPropagator).vs.sz;
  uVar4 = local_2c - uVar1;
  if (((int)uVar1 <= (int)local_2c) &&
     ((int)local_2c < (int)(uVar1 + (this->super_GraphPropagator).es.sz))) {
    local_2c = uVar4;
    bVar3 = BoolView::isTrue((this->super_GraphPropagator).es.data + uVar4);
    if (((bVar3) && (lVar5 = 0x138, this->last_state_e[(int)local_2c].v != 0)) ||
       ((bVar3 = BoolView::isFalse((this->super_GraphPropagator).es.data + local_2c), bVar3 &&
        (lVar5 = 0x168, this->last_state_e[(int)local_2c].v != 1)))) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 ((long)&(this->super_GraphPropagator).super_Propagator._vptr_Propagator + lVar5),
                 (int *)&local_2c);
      goto LAB_001a5f6c;
    }
  }
  if (bVar2) {
    return;
  }
LAB_001a5f6c:
  Propagator::pushInQueue((Propagator *)this);
  return;
}

Assistant:

void DReachabilityPropagator::wakeup(int i, int /*c*/) {
	update_innodes();

	bool ignore = true;
	if (DEBUG) {
		std::cout << "Wake up " << i << '\n';
	}
	if (i >= 0 && i < nbNodes()) {
		assert(getNodeVar(i).isFixed());
		if (getNodeVar(i).isTrue() && last_state_n[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add node " << i << '\n';
			}
			if (DEBUG) {
				std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
			}
			add_innode(i);
			new_node.insert(i);
			ignore = false;
		} else if (getNodeVar(i).isFalse() && last_state_n[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem node " << i << '\n';
			}
			rem_node.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring node " << i << '\n';
			}
		}
	}

	if (i >= nbNodes() && i < nbNodes() + nbEdges()) {
		i = i - nbNodes();
		assert(getEdgeVar(i).isFixed());
		if (getEdgeVar(i).isTrue() && last_state_e[i] != VT_IN) {
			if (DEBUG) {
				std::cout << "WakeUp Add edge" << i << '\n';
			}
			new_edge.insert(i);
			ignore = false;
		} else if (getEdgeVar(i).isFalse() && last_state_e[i] != VT_OUT) {
			if (DEBUG) {
				std::cout << "WakeUp Rem edge " << i << '\n';
			}
			rem_edge.insert(i);
			ignore = false;
		} else {
			if (DEBUG) {
				std::cout << "Ignoring edge " << i << '\n';
			}
		}
	}

	if (!ignore) {
		pushInQueue();
	} else {
	}
}